

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  stat buf;
  undefined8 local_c0 [3];
  uint local_a8;
  
  *zBuf = '\0';
  pcVar4 = sqlite3_temp_directory;
  if (unixTempFileDir_azDirs == (char *)0x0) {
    unixTempFileDir_azDirs = getenv("SQLITE_TMPDIR");
  }
  if (DAT_001d7b98 == (char *)0x0) {
    DAT_001d7b98 = getenv("TMPDIR");
  }
  lVar3 = 0;
  while ((((pcVar4 == (char *)0x0 || (iVar1 = (*aSyscall[4].pCurrent)(pcVar4,local_c0), iVar1 != 0))
          || ((local_a8 & 0xf000) != 0x4000)) ||
         (iVar1 = (*aSyscall[2].pCurrent)(pcVar4,3), iVar1 != 0))) {
    if (lVar3 == 0x30) {
      return 0x190a;
    }
    pcVar4 = *(char **)((long)&unixTempFileDir_azDirs + lVar3);
    lVar3 = lVar3 + 8;
  }
  uVar2 = 0;
  while( true ) {
    sqlite3_randomness(8,local_c0);
    zBuf[(long)nBuf + -2] = '\0';
    sqlite3_snprintf(nBuf,zBuf,"%s/etilqs_%llx%c",pcVar4,local_c0[0],0);
    if (zBuf[(long)nBuf + -2] != '\0') {
      return 1;
    }
    if (10 < uVar2) break;
    uVar2 = uVar2 + 1;
    iVar1 = (*aSyscall[2].pCurrent)(zBuf,0);
    if (iVar1 != 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) return SQLITE_IOERR_GETTEMPPATH;
  do{
    u64 r;
    sqlite3_randomness(sizeof(r), &r);
    assert( nBuf>2 );
    zBuf[nBuf-2] = 0;
    sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                     zDir, r, 0);
    if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ) return SQLITE_ERROR;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}